

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O3

HullError __thiscall
HACD::HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  HaF64 *pHVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  size_t __size;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  HullResult *pHVar14;
  bool bVar15;
  ulong uVar16;
  HaF32 *pHVar17;
  HaF64 *vertexCloud;
  dgBigVector *pdVar18;
  HaU32 *pHVar19;
  HaF32 *pHVar20;
  HaU32 *pHVar21;
  long lVar22;
  uint i;
  uint uVar23;
  HullError HVar24;
  HullLibrary *this_00;
  HaU32 HVar25;
  uint uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  HaF32 in_XMM0_Da;
  undefined1 auVar31 [16];
  undefined1 in_register_000012c4 [12];
  HaU32 ovcount;
  HaF32 local_d8;
  HaF32 local_d4;
  HaF32 *local_d0;
  HaU32 *local_c8;
  undefined8 uStack_c0;
  HaF32 *local_b8;
  undefined8 uStack_b0;
  HullResult *local_a8;
  HaF32 *local_a0;
  HaF32 center [3];
  HaF32 scale [3];
  dgConvexHull3d convexHull;
  
  uVar23 = desc->mVcount;
  uVar16 = 8;
  if (8 < uVar23) {
    uVar16 = (ulong)uVar23;
  }
  pHVar17 = (HaF32 *)malloc(uVar16 * 0xc);
  bVar15 = NormalizeAndCleanupVertices
                     ((HullLibrary *)center,uVar23,desc->mVertices,(uint)desc->mUseWuQuantizer,
                      &ovcount,pHVar17,in_XMM0_Da,scale,center,desc->mMaxVertices * 2,
                      desc->mUseWuQuantizer);
  HVar25 = ovcount;
  HVar24 = QE_FAIL;
  if (bVar15) {
    uVar16 = (ulong)ovcount;
    vertexCloud = (HaF64 *)malloc(uVar16 * 0x18);
    if (uVar16 != 0) {
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      iVar11 = HVar25 * 3;
      auVar29 = vpbroadcastq_avx512f();
      uVar16 = 0;
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar30,auVar28);
        uVar10 = vpcmpuq_avx512f(auVar30,auVar29,2);
        pHVar20 = pHVar17 + uVar16;
        auVar27._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * (int)pHVar20[1];
        auVar27._0_4_ = (uint)((byte)uVar10 & 1) * (int)*pHVar20;
        auVar27._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * (int)pHVar20[2];
        auVar27._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * (int)pHVar20[3];
        auVar27._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * (int)pHVar20[4];
        auVar27._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * (int)pHVar20[5];
        auVar27._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * (int)pHVar20[6];
        auVar27._28_4_ = (uint)(byte)(uVar10 >> 7) * (int)pHVar20[7];
        auVar30 = vcvtps2pd_avx512f(auVar27);
        pHVar1 = vertexCloud + uVar16;
        bVar15 = (bool)((byte)uVar10 & 1);
        bVar3 = (bool)((byte)(uVar10 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar10 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar10 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar10 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar10 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar10 >> 6) & 1);
        *pHVar1 = (HaF64)((ulong)bVar15 * auVar30._0_8_ | (ulong)!bVar15 * (long)*pHVar1);
        pHVar1[1] = (HaF64)((ulong)bVar3 * auVar30._8_8_ | (ulong)!bVar3 * (long)pHVar1[1]);
        pHVar1[2] = (HaF64)((ulong)bVar4 * auVar30._16_8_ | (ulong)!bVar4 * (long)pHVar1[2]);
        pHVar1[3] = (HaF64)((ulong)bVar5 * auVar30._24_8_ | (ulong)!bVar5 * (long)pHVar1[3]);
        pHVar1[4] = (HaF64)((ulong)bVar6 * auVar30._32_8_ | (ulong)!bVar6 * (long)pHVar1[4]);
        pHVar1[5] = (HaF64)((ulong)bVar7 * auVar30._40_8_ | (ulong)!bVar7 * (long)pHVar1[5]);
        pHVar1[6] = (HaF64)((ulong)bVar8 * auVar30._48_8_ | (ulong)!bVar8 * (long)pHVar1[6]);
        pHVar1[7] = (HaF64)((uVar10 >> 7) * auVar30._56_8_ |
                           (ulong)!SUB81(uVar10 >> 7,0) * (long)pHVar1[7]);
        uVar16 = uVar16 + 8;
      } while (((ulong)(iVar11 + (uint)(iVar11 == 0)) + 7 & 0xfffffffffffffff8) != uVar16);
    }
    dgConvexHull3d::dgConvexHull3d
              (&convexHull,vertexCloud,0x18,HVar25,9.999999747378752e-05,desc->mMaxVertices);
    uVar23 = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count == 0) {
      HVar24 = QE_FAIL;
    }
    else {
      lVar22 = (long)convexHull.m_count;
      local_a8 = result;
      local_a0 = pHVar17;
      pHVar17 = (HaF32 *)malloc(lVar22 * 0xc);
      uVar26 = 0;
      HVar25 = 0;
      local_d0 = pHVar17;
      if (lVar22 != 0) {
        i = 0;
        local_c8 = (HaU32 *)center._0_8_;
        uStack_c0 = 0;
        local_b8 = (HaF32 *)scale._0_8_;
        uStack_b0 = 0;
        local_d4 = scale[2];
        local_d8 = center[2];
        do {
          pdVar18 = dgArray<dgBigVector>::operator[](&convexHull.m_points,i);
          auVar9._0_8_ = (pdVar18->super_dgTemplateVector<double>).m_x;
          auVar9._8_8_ = (pdVar18->super_dgTemplateVector<double>).m_y;
          auVar9 = vcvtpd2ps_avx(auVar9);
          auVar12._8_8_ = uStack_c0;
          auVar12._0_8_ = local_c8;
          i = i + 1;
          auVar13._8_8_ = uStack_b0;
          auVar13._0_8_ = local_b8;
          auVar9 = vfmadd132ps_fma(auVar9,auVar12,auVar13);
          uVar2 = vmovlps_avx(auVar9);
          *(undefined8 *)pHVar17 = uVar2;
          auVar31._0_4_ = (float)(pdVar18->super_dgTemplateVector<double>).m_z;
          auVar31._4_12_ = in_register_000012c4;
          auVar9 = vfmadd132ss_fma(auVar31,ZEXT416((uint)local_d8),ZEXT416((uint)local_d4));
          pHVar17[2] = auVar9._0_4_;
          pHVar17 = pHVar17 + 3;
          uVar23 = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
          HVar25 = convexHull.m_count;
        } while (i < (uint)convexHull.m_count);
      }
      __size = (ulong)uVar23 * 0xc;
      pHVar19 = (HaU32 *)malloc(__size);
      if (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0) {
        uVar26 = 0;
        pHVar21 = pHVar19;
        do {
          uVar26 = uVar26 + 1;
          *pHVar21 = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[0];
          pHVar21[1] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[1];
          pHVar21[2] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[2];
          pHVar21 = pHVar21 + 3;
          convexHull.super_dgList<dgConvexHull3DFace>.m_first =
               (convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_next;
        } while (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0);
      }
      if (uVar26 != uVar23) {
        __assert_fail("outCount == triangleCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                      ,0x5e,
                      "HullError HACD::HullLibrary::CreateConvexHull(const HullDesc &, HullResult &)"
                     );
      }
      this_00 = (HullLibrary *)((long)(int)HVar25 * 0xc);
      local_b8 = (HaF32 *)malloc((size_t)this_00);
      BringOutYourDead(this_00,local_d0,HVar25,local_b8,&ovcount,pHVar19,uVar23 * 3);
      pHVar14 = local_a8;
      local_a8->mNumOutputVertices = ovcount;
      local_c8 = pHVar19;
      pHVar20 = (HaF32 *)malloc((ulong)ovcount * 0xc);
      pHVar14->mOutputVertices = pHVar20;
      pHVar14->mNumTriangles = uVar23;
      pHVar21 = (HaU32 *)malloc(__size);
      pHVar17 = local_b8;
      pHVar14->mIndices = pHVar21;
      memcpy(pHVar20,local_b8,(ulong)ovcount * 0xc);
      pHVar19 = local_c8;
      memcpy(pHVar21,local_c8,__size);
      free(pHVar19);
      free(pHVar17);
      HVar24 = QE_OK;
      pHVar17 = local_a0;
    }
    free(vertexCloud);
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  free(pHVar17);
  return HVar24;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
										HullResult           &result)         // contains the results
{
	HullError ret = QE_FAIL;

	hacd::HaU32 vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	hacd::HaF32 *vsource  = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*vcount*3 );
	hacd::HaF32 scale[3];
	hacd::HaF32 center[3];

	hacd::HaU32 ovcount;
	bool ok = NormalizeAndCleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale, center, desc.mMaxVertices*2, desc.mUseWuQuantizer ); // normalize point cloud, remove duplicates!
	if ( ok )
	{
		HaF64 *bigVertices = (HaF64 *)HACD_ALLOC(sizeof(HaF64)*3*ovcount);
		for (HaU32 i=0; i<3*ovcount; i++)
		{
			bigVertices[i] = vsource[i];
		}

		dgConvexHull3d convexHull(bigVertices,sizeof(HaF64)*3,ovcount,0.0001f,desc.mMaxVertices);

		if ( convexHull.GetCount() )
		{
			HaF32 *hullVertices = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*convexHull.GetVertexCount() );

			HaF32 *dest = hullVertices;
			for (HaU32 i=0; i<(HaU32)convexHull.GetVertexCount(); i++)
			{
				const dgBigVector &v = convexHull.GetVertex(i);
				dest[0] = (HaF32)v.m_x*scale[0]+center[0];
				dest[1] = (HaF32)v.m_y*scale[1]+center[1];
				dest[2] = (HaF32)v.m_z*scale[2]+center[2];
				dest+=3;
			}

			HaU32 triangleCount = convexHull.GetCount();
			HaU32 *indices = (HaU32*)HACD_ALLOC(triangleCount*sizeof(HaU32)*3);
			HaU32 *destIndices = indices;
			dgList<dgConvexHull3DFace>::Iterator iter(convexHull);
			HaU32 outCount = 0;
			for (iter.Begin(); iter; iter++)
			{
				dgConvexHull3DFace &face = (*iter);
				destIndices[0] = face.m_index[0];
				destIndices[1] = face.m_index[1];
				destIndices[2] = face.m_index[2];
				destIndices+=3;
				outCount++;
			}
			HACD_ASSERT( outCount == triangleCount );

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			hacd::HaF32 *vscratch = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*convexHull.GetVertexCount()*3 );
			BringOutYourDead(hullVertices,convexHull.GetVertexCount(),vscratch, ovcount, indices, triangleCount*3 );

			ret = QE_OK;

			result.mNumOutputVertices	= ovcount;
			result.mOutputVertices		= (hacd::HaF32 *)HACD_ALLOC( sizeof(hacd::HaF32)*ovcount*3);
			result.mNumTriangles		= triangleCount;
			result.mIndices           = (hacd::HaU32 *) HACD_ALLOC( sizeof(hacd::HaU32)*triangleCount*3);
			memcpy(result.mOutputVertices, vscratch, sizeof(hacd::HaF32)*3*ovcount );
			memcpy(result.mIndices, indices, sizeof(hacd::HaU32)*triangleCount*3);

			HACD_FREE(indices);
			HACD_FREE(vscratch);
		}

		HACD_FREE(bigVertices);
	}

	HACD_FREE(vsource);

	return ret;
}